

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O1

void __thiscall USBControlTransferParser::ResetParser(USBControlTransferParser *this)

{
  pointer puVar1;
  
  this->mDescBytes = 0;
  this->mDescType = DT_Undefined;
  this->mDescSubtype = DST_Undefined;
  this->mParsedOffset = 0;
  this->mLeftover = 0;
  (this->mRequest).bmRequestType = '\0';
  (this->mRequest).bRequest = '\0';
  (this->mRequest).wValue = 0;
  (this->mRequest).wIndex = 0;
  (this->mRequest).wLength = 0;
  this->mAddress = '\0';
  this->mHidIndentLevel = 0;
  this->mHidItemCnt = 0;
  this->pPacket = (USBPacket *)0x0;
  this->mPacketOffset = 0;
  this->mPacketDataBytes = 0;
  this->mHidRepDescItem[0] = '\0';
  this->mHidRepDescItem[1] = '\0';
  this->mHidRepDescItem[2] = '\0';
  this->mHidRepDescItem[3] = '\0';
  *(undefined2 *)(this->mHidRepDescItem + 4) = 0;
  puVar1 = (this->mHidUsagePageStack).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mHidUsagePageStack).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->mHidUsagePageStack).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void USBControlTransferParser::ResetParser()
{
    mParsedOffset = mDescBytes = 0;
    mDescType = DT_Undefined;
    mDescSubtype = DST_Undefined;
    mLeftover = 0;

    mRequest.Clear();

    mAddress = 0;

    pPacket = NULL;
    mPacketDataBytes = mPacketOffset = 0;

    mHidRepDescBytes = 0;
    memset( mHidRepDescItem, 0, sizeof mHidRepDescItem );
    mHidIndentLevel = mHidItemCnt = 0;
    mHidUsagePageStack.clear();
}